

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O3

void __thiscall
Voxelizer::CmdVoxelize(Voxelizer *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  CommandBuffer *pCVar1;
  element_type *peVar2;
  long lVar3;
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  uint32_t push_constants [1];
  undefined8 uStack_80;
  vector<VkClearValue,_std::allocator<VkClearValue>_> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  Ptr<PipelineBase> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  local_30;
  
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdBeginRenderPass
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_render_pass,&this->m_framebuffer,&local_78,VK_SUBPASS_CONTENTS_INLINE);
  if (local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_pipeline).
                super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_pipeline).
                super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
    }
  }
  myvk::CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_78);
  if (local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               &(local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                 super__Vector_impl_data._M_finish)->depthStencil);
  }
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
              super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_finish + 8) + 1;
    }
  }
  peVar2 = (this->m_scene_ptr).super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(peVar2->m_descriptor_set).
                super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60 = (peVar2->m_descriptor_set).
             super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&local_78;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector(&local_30,__l,(allocator_type *)((long)&uStack_80 + 7));
  local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_PipelineBase;
  local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdBindDescriptorSets(pCVar1,&local_30,&local_58,&local_48);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector(&local_30);
  lVar3 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_80 + lVar3) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_80 + lVar3));
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  myvk::CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,0x10,0,4,&local_78);
  Scene::CmdDraw((this->m_scene_ptr).super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 command_buffer,&this->m_pipeline_layout,4);
  myvk::CommandBuffer::CmdEndRenderPass
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  return;
}

Assistant:

void Voxelizer::CmdVoxelize(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) const {
	command_buffer->CmdBeginRenderPass(m_render_pass, m_framebuffer, {});
	{
		command_buffer->CmdBindPipeline(m_pipeline);
		command_buffer->CmdBindDescriptorSets({m_descriptor_set, m_scene_ptr->GetDescriptorSet()}, m_pipeline, {});

		uint32_t push_constants[] = {0};
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t),
		                                 push_constants);
		m_scene_ptr->CmdDraw(command_buffer, m_pipeline_layout, sizeof(uint32_t));
	}
	command_buffer->CmdEndRenderPass();
}